

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_builder_morton.h
# Opt level: O3

void __thiscall
embree::sse2::BVHBuilderMorton::
BuilderT<embree::BVHNodeRecord<embree::NodeRefPtr<4>_>,_embree::FastAllocator::CachedAllocator,_embree::BVHN<4>::CreateAlloc,_embree::AABBNode_t<embree::NodeRefPtr<4>,_4>::Create,_embree::sse2::SetBVHNBounds<4>,_embree::sse2::CreateMortonLeaf<4,_embree::InstanceArrayPrimitive>,_embree::sse2::CalculateMeshBounds<embree::InstanceArray>,_embree::Scene::BuildProgressMonitorInterface>
::recreateMortonCodes
          (BuilderT<embree::BVHNodeRecord<embree::NodeRefPtr<4>_>,_embree::FastAllocator::CachedAllocator,_embree::BVHN<4>::CreateAlloc,_embree::AABBNode_t<embree::NodeRefPtr<4>,_4>::Create,_embree::sse2::SetBVHNBounds<4>,_embree::sse2::CreateMortonLeaf<4,_embree::InstanceArrayPrimitive>,_embree::sse2::CalculateMeshBounds<embree::InstanceArray>,_embree::Scene::BuildProgressMonitorInterface>
           *this,range<unsigned_int> *current)

{
  float *pfVar1;
  BuildPrim *pBVar2;
  BuildPrim *pBVar3;
  RTCFormat RVar4;
  InstanceArray *pIVar5;
  RawBufferView *pRVar6;
  char *pcVar7;
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  char cVar11;
  runtime_error *prVar12;
  ulong uVar13;
  ulong uVar14;
  ulong uVar15;
  Accel *pAVar16;
  long lVar17;
  Accel *pAVar18;
  uint uVar19;
  ulong uVar20;
  float fVar21;
  uint uVar22;
  float fVar26;
  uint uVar27;
  float fVar28;
  uint uVar30;
  float fVar31;
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  float fVar29;
  undefined1 auVar25 [16];
  float fVar32;
  undefined8 extraout_XMM1_Qa;
  float fVar35;
  float fVar36;
  float fVar37;
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined8 extraout_XMM1_Qb;
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 in_XMM3 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  float in_XMM4_Da;
  float in_XMM4_Db;
  float fVar43;
  float in_XMM4_Dc;
  float fVar44;
  float in_XMM4_Dd;
  float fVar45;
  float in_XMM5_Da;
  float in_XMM5_Db;
  float in_XMM5_Dc;
  float in_XMM5_Dd;
  undefined1 in_XMM6 [16];
  undefined1 auVar46 [16];
  float fVar50;
  undefined1 in_XMM7 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  float fVar51;
  float fVar52;
  float fVar55;
  float fVar58;
  undefined1 auVar53 [16];
  float fVar56;
  float fVar57;
  float fVar59;
  float fVar60;
  float fVar61;
  undefined1 auVar54 [16];
  float fVar62;
  float fVar64;
  float fVar65;
  undefined1 in_XMM9 [16];
  vfloat4 lower;
  undefined1 auVar63 [16];
  float fVar66;
  float fVar67;
  float fVar69;
  float fVar70;
  float fVar71;
  undefined1 in_XMM10 [16];
  vfloat4 upper;
  undefined1 auVar68 [16];
  float fVar72;
  float fVar73;
  float in_XMM11_Da;
  float fVar74;
  float in_XMM11_Db;
  float fVar75;
  float in_XMM11_Dc;
  float fVar76;
  float in_XMM11_Dd;
  float fVar77;
  float in_XMM13_Da;
  float in_XMM13_Db;
  float in_XMM13_Dc;
  float in_XMM13_Dd;
  float in_XMM14_Da;
  float in_XMM14_Db;
  float in_XMM14_Dc;
  float in_XMM14_Dd;
  float in_XMM15_Da;
  float in_XMM15_Db;
  float in_XMM15_Dc;
  float in_XMM15_Dd;
  anon_class_8_1_8991fb9c calculateCentBounds;
  MortonCodeMapping mapping;
  task_group_context context;
  auto_partitioner local_1c9;
  float local_1c8;
  float fStack_1c4;
  float fStack_1c0;
  float fStack_1bc;
  undefined1 local_1b8 [8];
  undefined8 uStack_1b0;
  float local_1a8;
  float fStack_1a4;
  float fStack_1a0;
  float fStack_19c;
  float local_198;
  float fStack_194;
  float fStack_190;
  float fStack_18c;
  undefined8 local_188;
  undefined8 uStack_180;
  float local_178;
  float fStack_174;
  float fStack_170;
  float fStack_16c;
  float local_168;
  float fStack_164;
  float fStack_160;
  float fStack_15c;
  undefined1 local_158 [16];
  anon_class_8_1_8991fb9c local_140;
  undefined8 local_138;
  lambda_reduce_body<tbb::detail::d1::blocked_range<unsigned_int>,_embree::BBox<embree::Vec3fa>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_embree[P]embree_kernels_bvh____builders_______common_algorithms_parallel_reduce_h:59:7),_const_embree::BBox<embree::Vec3fa>_(const_embree::BBox<embree::Vec3fa>_&,_const_embree::BBox<embree::Vec3fa>_&)>
  *local_130;
  anon_class_16_2_ed117de8_conflict24 local_128;
  lambda_reduce_body<tbb::detail::d1::blocked_range<unsigned_int>,_embree::BBox<embree::Vec3fa>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_embree[P]embree_kernels_bvh____builders_______common_algorithms_parallel_reduce_h:59:7),_const_embree::BBox<embree::Vec3fa>_(const_embree::BBox<embree::Vec3fa>_&,_const_embree::BBox<embree::Vec3fa>_&)>
  local_118;
  task_group_context local_d8;
  anon_union_16_2_47237d3f_for_Vec3fa_0 local_58;
  undefined8 local_48;
  undefined8 uStack_40;
  
  uVar22 = current->_begin;
  uVar20 = (ulong)uVar22;
  uVar27 = current->_end;
  uVar13 = (ulong)uVar27;
  if (uVar27 - uVar22 < 0x400) {
    auVar38 = _DAT_01f7aa00;
    if (uVar22 < uVar27) {
      pIVar5 = this->calculateBounds->mesh;
      pAVar16 = *(Accel **)&(pIVar5->super_Geometry).field_0x58;
      uStack_1b0 = 0x7f8000007f800000;
      local_1b8 = (undefined1  [8])0x7f8000007f800000;
      uVar14 = uVar20;
      do {
        uVar15 = (ulong)this->morton[uVar14].field_0.field_0.index;
        if ((pAVar16 != (Accel *)0x0) ||
           (*(int *)((pIVar5->object_ids).super_RawBufferView.ptr_ofs +
                    (pIVar5->object_ids).super_RawBufferView.stride * uVar15) != -1)) {
          pRVar6 = (pIVar5->l2w_buf).items;
          RVar4 = pRVar6->format;
          if ((pIVar5->super_Geometry).field_8.field_0x1 == '\x01') {
            local_188 = (BBox<embree::Vec3fa> *)CONCAT44(in_XMM13_Db,in_XMM13_Da);
            uStack_180 = (anon_class_16_2_ed117de8_conflict24 *)CONCAT44(in_XMM13_Dd,in_XMM13_Dc);
            if ((int)RVar4 < 0x9244) {
              if (RVar4 == RTC_FORMAT_FLOAT3X4_ROW_MAJOR) {
                pcVar7 = pRVar6->ptr_ofs;
                lVar17 = pRVar6->stride * uVar15;
                fStack_1c4 = *(float *)(pcVar7 + lVar17 + 0x10);
                local_1c8 = *(float *)(pcVar7 + lVar17);
                in_XMM14_Da = *(float *)(pcVar7 + lVar17 + 4);
                local_178 = *(float *)(pcVar7 + lVar17 + 8);
                local_198 = *(float *)(pcVar7 + lVar17 + 0xc);
                fStack_1c0 = *(float *)(pcVar7 + lVar17 + 0x20);
                fStack_1bc = 0.0;
                in_XMM14_Db = *(float *)(pcVar7 + lVar17 + 0x14);
                in_XMM14_Dc = *(float *)(pcVar7 + lVar17 + 0x24);
                in_XMM14_Dd = 0.0;
                fStack_174 = *(float *)(pcVar7 + lVar17 + 0x18);
                fStack_170 = *(float *)(pcVar7 + lVar17 + 0x28);
                fStack_16c = 0.0;
                fStack_194 = *(float *)(pcVar7 + lVar17 + 0x1c);
                fStack_190 = *(float *)(pcVar7 + lVar17 + 0x2c);
                fStack_18c = 0.0;
              }
              else if (RVar4 == RTC_FORMAT_FLOAT3X4_COLUMN_MAJOR) {
                pcVar7 = pRVar6->ptr_ofs;
                lVar17 = pRVar6->stride * uVar15;
                local_1c8 = *(float *)(pcVar7 + lVar17);
                fStack_1c4 = (float)*(undefined8 *)(pcVar7 + lVar17 + 4);
                fStack_1c0 = (float)((ulong)*(undefined8 *)(pcVar7 + lVar17 + 4) >> 0x20);
                fStack_1bc = 0.0;
                in_XMM14_Da = *(float *)(pcVar7 + lVar17 + 0xc);
                in_XMM14_Db = (float)*(undefined8 *)(pcVar7 + lVar17 + 0x10);
                in_XMM14_Dc = (float)((ulong)*(undefined8 *)(pcVar7 + lVar17 + 0x10) >> 0x20);
                in_XMM14_Dd = 0.0;
                local_178 = *(float *)(pcVar7 + lVar17 + 0x18);
                fStack_174 = (float)*(undefined8 *)(pcVar7 + lVar17 + 0x1c);
                fStack_170 = (float)((ulong)*(undefined8 *)(pcVar7 + lVar17 + 0x1c) >> 0x20);
                fStack_16c = 0.0;
                local_198 = *(float *)(pcVar7 + lVar17 + 0x24);
                fStack_194 = (float)*(undefined8 *)(pcVar7 + lVar17 + 0x28);
                fStack_190 = (float)((ulong)*(undefined8 *)(pcVar7 + lVar17 + 0x28) >> 0x20);
                fStack_18c = 0.0;
              }
            }
            else if (RVar4 == RTC_FORMAT_QUATERNION_DECOMPOSITION) {
              pcVar7 = pRVar6->ptr_ofs;
              lVar17 = pRVar6->stride * uVar15;
              local_178 = *(float *)(pcVar7 + lVar17 + 0x10);
              fStack_174 = *(float *)((long)(pcVar7 + lVar17 + 0x10) + 4);
              local_1c8 = *(float *)(pcVar7 + lVar17);
              in_XMM14_Db = *(float *)(pcVar7 + lVar17 + 4);
              fStack_170 = *(float *)(pcVar7 + lVar17 + 8);
              in_XMM14_Da = *(float *)(pcVar7 + lVar17 + 0xc);
              fStack_1c4 = (float)*(undefined8 *)(pcVar7 + lVar17 + 0x34);
              fStack_1c0 = (float)((ulong)*(undefined8 *)(pcVar7 + lVar17 + 0x34) >> 0x20);
              local_198 = *(float *)(pcVar7 + lVar17 + 0x18);
              fStack_194 = (float)*(undefined8 *)(pcVar7 + lVar17 + 0x1c);
              fStack_190 = (float)((ulong)*(undefined8 *)(pcVar7 + lVar17 + 0x1c) >> 0x20);
              fVar55 = *(float *)(pcVar7 + lVar17 + 0x24);
              fStack_1bc = *(float *)(pcVar7 + lVar17 + 0x28);
              fVar51 = *(float *)(pcVar7 + lVar17 + 0x2c);
              fVar60 = *(float *)(pcVar7 + lVar17 + 0x30);
              fVar62 = fVar60 * fVar60 + fVar51 * fVar51 + fVar55 * fVar55 + fStack_1bc * fStack_1bc
              ;
              auVar68 = rsqrtss(ZEXT416((uint)fVar62),ZEXT416((uint)fVar62));
              fVar58 = auVar68._0_4_;
              fVar58 = fVar58 * fVar58 * fVar62 * -0.5 * fVar58 + fVar58 * 1.5;
              fStack_18c = fVar55 * fVar58;
              fStack_1bc = fStack_1bc * fVar58;
              in_XMM14_Dd = fVar51 * fVar58;
              fStack_16c = fVar58 * fVar60;
              in_XMM14_Dc = *(float *)(pcVar7 + lVar17 + 0x3c);
            }
            else if (RVar4 == RTC_FORMAT_FLOAT4X4_COLUMN_MAJOR) {
              pcVar7 = pRVar6->ptr_ofs;
              lVar17 = pRVar6->stride * uVar15;
              pfVar1 = (float *)(pcVar7 + lVar17);
              local_1c8 = *pfVar1;
              fStack_1c4 = pfVar1[1];
              fStack_1c0 = pfVar1[2];
              fStack_1bc = pfVar1[3];
              pfVar1 = (float *)(pcVar7 + lVar17 + 0x10);
              in_XMM14_Da = *pfVar1;
              in_XMM14_Db = pfVar1[1];
              in_XMM14_Dc = pfVar1[2];
              in_XMM14_Dd = pfVar1[3];
              pfVar1 = (float *)(pcVar7 + lVar17 + 0x20);
              local_178 = *pfVar1;
              fStack_174 = pfVar1[1];
              fStack_170 = pfVar1[2];
              fStack_16c = pfVar1[3];
              pfVar1 = (float *)(pcVar7 + lVar17 + 0x30);
              local_198 = *pfVar1;
              fStack_194 = pfVar1[1];
              fStack_190 = pfVar1[2];
              fStack_18c = pfVar1[3];
            }
            local_158._4_4_ = fStack_1c0;
            local_158._0_4_ = fStack_1c4;
            local_158._8_4_ = in_XMM14_Dc;
            local_158._12_4_ = 0;
            fVar64 = fStack_1bc * in_XMM14_Dd + fStack_16c * fStack_18c;
            fVar32 = fStack_1bc * in_XMM14_Dd - fStack_16c * fStack_18c;
            fVar65 = fStack_18c * fStack_18c + fStack_1bc * fStack_1bc + -in_XMM14_Dd * in_XMM14_Dd
                     + -fStack_16c * fStack_16c;
            fVar62 = fStack_18c * fStack_18c - fStack_1bc * fStack_1bc;
            fVar51 = in_XMM14_Dd * in_XMM14_Dd + fVar62 + -fStack_16c * fStack_16c;
            fVar60 = fStack_1bc * fStack_16c - in_XMM14_Dd * fStack_18c;
            fVar58 = in_XMM14_Dd * fStack_18c + fStack_1bc * fStack_16c;
            fVar55 = in_XMM14_Dd * fStack_16c + fStack_1bc * fStack_18c;
            fVar50 = in_XMM14_Dd * fStack_16c - fStack_1bc * fStack_18c;
            fVar62 = fStack_16c * fStack_16c + fVar62 + -in_XMM14_Dd * in_XMM14_Dd;
            fVar64 = fVar64 + fVar64;
            fVar60 = fVar60 + fVar60;
            fVar32 = fVar32 + fVar32;
            fVar55 = fVar55 + fVar55;
            fVar58 = fVar58 + fVar58;
            fVar50 = fVar50 + fVar50;
            fVar21 = fVar65 * 1.0 + fVar64 * 0.0 + fVar60 * 0.0;
            fVar26 = fVar65 * 0.0 + fVar64 * 1.0 + fVar60 * 0.0;
            fVar28 = fVar65 * 0.0 + fVar64 * 0.0 + fVar60 * 1.0;
            fVar31 = fVar65 * 0.0 + fVar64 * 0.0 + fVar60 * 0.0;
            fVar66 = fVar32 * 1.0 + fVar51 * 0.0 + fVar55 * 0.0;
            fVar71 = fVar32 * 0.0 + fVar51 * 1.0 + fVar55 * 0.0;
            fVar73 = fVar32 * 0.0 + fVar51 * 0.0 + fVar55 * 1.0;
            fVar77 = fVar32 * 0.0 + fVar51 * 0.0 + fVar55 * 0.0;
            fVar32 = fVar58 * 1.0 + fVar50 * 0.0 + fVar62 * 0.0;
            fVar35 = fVar58 * 0.0 + fVar50 * 1.0 + fVar62 * 0.0;
            fVar36 = fVar58 * 0.0 + fVar50 * 0.0 + fVar62 * 1.0;
            fVar37 = fVar58 * 0.0 + fVar50 * 0.0 + fVar62 * 0.0;
            fVar62 = local_1c8 * fVar21 + fVar66 * 0.0 + fVar32 * 0.0;
            fVar64 = local_1c8 * fVar26 + fVar71 * 0.0 + fVar35 * 0.0;
            fVar65 = local_1c8 * fVar28 + fVar73 * 0.0 + fVar36 * 0.0;
            fVar50 = local_1c8 * fVar31 + fVar77 * 0.0 + fVar37 * 0.0;
            fVar51 = in_XMM14_Da * fVar21 + in_XMM14_Db * fVar66 + fVar32 * 0.0;
            fVar55 = in_XMM14_Da * fVar26 + in_XMM14_Db * fVar71 + fVar35 * 0.0;
            fVar58 = in_XMM14_Da * fVar28 + in_XMM14_Db * fVar73 + fVar36 * 0.0;
            fVar60 = in_XMM14_Da * fVar31 + in_XMM14_Db * fVar77 + fVar37 * 0.0;
            in_XMM13_Da = local_178 * fVar21 + fStack_174 * fVar66 + fStack_170 * fVar32;
            in_XMM13_Db = local_178 * fVar26 + fStack_174 * fVar71 + fStack_170 * fVar35;
            in_XMM13_Dc = local_178 * fVar28 + fStack_174 * fVar73 + fStack_170 * fVar36;
            in_XMM13_Dd = local_178 * fVar31 + fStack_174 * fVar77 + fStack_170 * fVar37;
            fVar32 = local_198 * fVar21 + fStack_194 * fVar66 + fStack_190 * fVar32 +
                     fStack_1c4 + 0.0;
            fVar35 = local_198 * fVar26 + fStack_194 * fVar71 + fStack_190 * fVar35 +
                     fStack_1c0 + 0.0;
            fVar36 = local_198 * fVar28 + fStack_194 * fVar73 + fStack_190 * fVar36 +
                     in_XMM14_Dc + 0.0;
            fVar37 = local_198 * fVar31 + fStack_194 * fVar77 + fStack_190 * fVar37 + 0.0;
            local_168 = in_XMM14_Da;
            fStack_164 = in_XMM14_Db;
            fStack_160 = in_XMM14_Dc;
            fStack_15c = in_XMM14_Dd;
          }
          else {
            fVar51 = in_XMM15_Da;
            fVar55 = in_XMM15_Db;
            fVar58 = in_XMM15_Dc;
            fVar60 = in_XMM15_Dd;
            if ((int)RVar4 < 0x9244) {
              if (RVar4 == RTC_FORMAT_FLOAT3X4_ROW_MAJOR) {
                pcVar7 = pRVar6->ptr_ofs;
                lVar17 = pRVar6->stride * uVar15;
                fStack_1a4 = *(float *)(pcVar7 + lVar17 + 0x10);
                local_1a8 = *(float *)(pcVar7 + lVar17);
                in_XMM13_Da = *(float *)(pcVar7 + lVar17 + 8);
                in_XMM4_Da = *(float *)(pcVar7 + lVar17 + 0xc);
                fStack_1a0 = *(float *)(pcVar7 + lVar17 + 0x20);
                fStack_19c = 0.0;
                in_XMM13_Db = *(float *)(pcVar7 + lVar17 + 0x18);
                in_XMM13_Dc = *(float *)(pcVar7 + lVar17 + 0x28);
                in_XMM13_Dd = 0.0;
                in_XMM4_Db = *(float *)(pcVar7 + lVar17 + 0x1c);
                in_XMM4_Dc = *(float *)(pcVar7 + lVar17 + 0x2c);
                in_XMM4_Dd = 0.0;
                fVar51 = *(float *)(pcVar7 + lVar17 + 4);
                fVar55 = *(float *)(pcVar7 + lVar17 + 0x14);
                fVar58 = *(float *)(pcVar7 + lVar17 + 0x24);
                fVar60 = 0.0;
              }
              else if (RVar4 == RTC_FORMAT_FLOAT3X4_COLUMN_MAJOR) {
                pcVar7 = pRVar6->ptr_ofs;
                lVar17 = pRVar6->stride * uVar15;
                local_1a8 = *(float *)(pcVar7 + lVar17);
                fStack_1a4 = (float)*(undefined8 *)(pcVar7 + lVar17 + 4);
                fStack_1a0 = (float)((ulong)*(undefined8 *)(pcVar7 + lVar17 + 4) >> 0x20);
                fStack_19c = 0.0;
                in_XMM13_Da = *(float *)(pcVar7 + lVar17 + 0x18);
                in_XMM13_Db = (float)*(undefined8 *)(pcVar7 + lVar17 + 0x1c);
                in_XMM13_Dc = (float)((ulong)*(undefined8 *)(pcVar7 + lVar17 + 0x1c) >> 0x20);
                in_XMM13_Dd = 0.0;
                in_XMM4_Da = *(float *)(pcVar7 + lVar17 + 0x24);
                in_XMM4_Db = (float)*(undefined8 *)(pcVar7 + lVar17 + 0x28);
                in_XMM4_Dc = (float)((ulong)*(undefined8 *)(pcVar7 + lVar17 + 0x28) >> 0x20);
                in_XMM4_Dd = 0.0;
                fVar51 = *(float *)(pcVar7 + lVar17 + 0xc);
                fVar55 = *(float *)(pcVar7 + lVar17 + 0x18);
                fVar58 = *(float *)(pcVar7 + lVar17 + 0x1c);
                fVar60 = 0.0;
              }
            }
            else if (RVar4 == RTC_FORMAT_QUATERNION_DECOMPOSITION) {
              pcVar7 = pRVar6->ptr_ofs;
              lVar17 = pRVar6->stride * uVar15;
              in_XMM13_Da = (float)*(undefined8 *)(pcVar7 + lVar17 + 0x10);
              in_XMM13_Db = (float)((ulong)*(undefined8 *)(pcVar7 + lVar17 + 0x10) >> 0x20);
              local_1a8 = *(float *)(pcVar7 + lVar17);
              fVar55 = *(float *)(pcVar7 + lVar17 + 4);
              in_XMM13_Dc = *(float *)(pcVar7 + lVar17 + 8);
              fVar51 = *(float *)(pcVar7 + lVar17 + 0xc);
              fStack_1a4 = (float)*(undefined8 *)(pcVar7 + lVar17 + 0x34);
              fStack_1a0 = (float)((ulong)*(undefined8 *)(pcVar7 + lVar17 + 0x34) >> 0x20);
              in_XMM4_Da = *(float *)(pcVar7 + lVar17 + 0x18);
              in_XMM4_Db = (float)*(undefined8 *)(pcVar7 + lVar17 + 0x1c);
              in_XMM4_Dc = (float)((ulong)*(undefined8 *)(pcVar7 + lVar17 + 0x1c) >> 0x20);
              fVar58 = *(float *)(pcVar7 + lVar17 + 0x24);
              fStack_19c = *(float *)(pcVar7 + lVar17 + 0x28);
              fVar60 = *(float *)(pcVar7 + lVar17 + 0x2c);
              fVar62 = *(float *)(pcVar7 + lVar17 + 0x30);
              fVar65 = fVar62 * fVar62 + fVar60 * fVar60 + fVar58 * fVar58 + fStack_19c * fStack_19c
              ;
              auVar68 = rsqrtss(ZEXT416((uint)fVar65),ZEXT416((uint)fVar65));
              fVar64 = auVar68._0_4_;
              fVar64 = fVar64 * fVar64 * fVar65 * -0.5 * fVar64 + fVar64 * 1.5;
              in_XMM4_Dd = fVar58 * fVar64;
              fStack_19c = fStack_19c * fVar64;
              fVar60 = fVar60 * fVar64;
              in_XMM13_Dd = fVar64 * fVar62;
              fVar58 = *(float *)(pcVar7 + lVar17 + 0x3c);
            }
            else if (RVar4 == RTC_FORMAT_FLOAT4X4_COLUMN_MAJOR) {
              pcVar7 = pRVar6->ptr_ofs;
              lVar17 = pRVar6->stride * uVar15;
              pfVar1 = (float *)(pcVar7 + lVar17);
              local_1a8 = *pfVar1;
              fStack_1a4 = pfVar1[1];
              fStack_1a0 = pfVar1[2];
              fStack_19c = pfVar1[3];
              pfVar1 = (float *)(pcVar7 + lVar17 + 0x10);
              fVar51 = *pfVar1;
              fVar55 = pfVar1[1];
              fVar58 = pfVar1[2];
              fVar60 = pfVar1[3];
              pfVar1 = (float *)(pcVar7 + lVar17 + 0x20);
              in_XMM13_Da = *pfVar1;
              in_XMM13_Db = pfVar1[1];
              in_XMM13_Dc = pfVar1[2];
              in_XMM13_Dd = pfVar1[3];
              pfVar1 = (float *)(pcVar7 + lVar17 + 0x30);
              in_XMM4_Da = *pfVar1;
              in_XMM4_Db = pfVar1[1];
              in_XMM4_Dc = pfVar1[2];
              in_XMM4_Dd = pfVar1[3];
            }
            local_188 = (BBox<embree::Vec3fa> *)CONCAT44(in_XMM13_Db,in_XMM13_Da);
            uStack_180 = (anon_class_16_2_ed117de8_conflict24 *)CONCAT44(in_XMM13_Dd,in_XMM13_Dc);
            fVar62 = local_1a8;
            fVar64 = fStack_1a4;
            fVar65 = fStack_1a0;
            fVar50 = fStack_19c;
            fVar32 = in_XMM4_Da;
            fVar35 = in_XMM4_Db;
            fVar36 = in_XMM4_Dc;
            fVar37 = in_XMM4_Dd;
            in_XMM15_Da = fVar51;
            in_XMM15_Db = fVar55;
            in_XMM15_Dc = fVar58;
            in_XMM15_Dd = fVar60;
          }
          pAVar18 = pAVar16;
          if (pAVar16 == (Accel *)0x0) {
            pAVar18 = pIVar5->objects
                      [*(uint *)((pIVar5->object_ids).super_RawBufferView.ptr_ofs +
                                uVar15 * (pIVar5->object_ids).super_RawBufferView.stride)];
          }
          auVar68 = minps((undefined1  [16])(pAVar18->super_AccelData).bounds.bounds0.lower.field_0,
                          (undefined1  [16])(pAVar18->super_AccelData).bounds.bounds1.lower.field_0)
          ;
          auVar63 = maxps((undefined1  [16])(pAVar18->super_AccelData).bounds.bounds0.upper.field_0,
                          (undefined1  [16])(pAVar18->super_AccelData).bounds.bounds1.upper.field_0)
          ;
          fVar77 = auVar68._0_4_;
          fVar29 = auVar68._4_4_;
          fVar21 = auVar68._8_4_;
          fVar67 = fVar21 * in_XMM13_Da + fVar32;
          fVar69 = fVar21 * in_XMM13_Db + fVar35;
          fVar70 = fVar21 * in_XMM13_Dc + fVar36;
          fVar72 = fVar21 * in_XMM13_Dd + fVar37;
          fVar21 = fVar29 * fVar51 + fVar67;
          fVar26 = fVar29 * fVar55 + fVar69;
          fVar28 = fVar29 * fVar58 + fVar70;
          fVar31 = fVar29 * fVar60 + fVar72;
          fVar74 = fVar77 * fVar62;
          fVar75 = fVar77 * fVar64;
          fVar76 = fVar77 * fVar65;
          fVar77 = fVar77 * fVar50;
          auVar41._0_4_ = fVar74 + fVar21;
          auVar41._4_4_ = fVar75 + fVar26;
          auVar41._8_4_ = fVar76 + fVar28;
          auVar41._12_4_ = fVar77 + fVar31;
          auVar68 = minps(_DAT_01f7a9f0,auVar41);
          auVar47 = maxps(_DAT_01f7aa00,auVar41);
          fVar66 = auVar63._0_4_;
          fVar71 = auVar63._4_4_;
          fVar73 = auVar63._8_4_;
          in_XMM3._0_4_ = fVar73 * in_XMM13_Da + fVar32;
          in_XMM3._4_4_ = fVar73 * in_XMM13_Db + fVar35;
          in_XMM3._8_4_ = fVar73 * in_XMM13_Dc + fVar36;
          in_XMM3._12_4_ = fVar73 * in_XMM13_Dd + fVar37;
          fVar32 = fVar29 * fVar51 + in_XMM3._0_4_;
          fVar35 = fVar29 * fVar55 + in_XMM3._4_4_;
          fVar36 = fVar29 * fVar58 + in_XMM3._8_4_;
          fVar37 = fVar29 * fVar60 + in_XMM3._12_4_;
          auVar53._0_4_ = fVar74 + fVar32;
          auVar53._4_4_ = fVar75 + fVar35;
          auVar53._8_4_ = fVar76 + fVar36;
          auVar53._12_4_ = fVar77 + fVar37;
          auVar68 = minps(auVar68,auVar53);
          auVar48 = maxps(auVar47,auVar53);
          fVar67 = fVar67 + fVar71 * fVar51;
          fVar69 = fVar69 + fVar71 * fVar55;
          fVar70 = fVar70 + fVar71 * fVar58;
          fVar72 = fVar72 + fVar71 * fVar60;
          in_XMM5_Da = fVar74 + fVar67;
          in_XMM5_Db = fVar75 + fVar69;
          in_XMM5_Dc = fVar76 + fVar70;
          in_XMM5_Dd = fVar77 + fVar72;
          auVar47._4_4_ = in_XMM5_Db;
          auVar47._0_4_ = in_XMM5_Da;
          auVar47._8_4_ = in_XMM5_Dc;
          auVar47._12_4_ = in_XMM5_Dd;
          auVar68 = minps(auVar68,auVar47);
          auVar63._4_4_ = in_XMM5_Db;
          auVar63._0_4_ = in_XMM5_Da;
          auVar63._8_4_ = in_XMM5_Dc;
          auVar63._12_4_ = in_XMM5_Dd;
          auVar47 = maxps(auVar48,auVar63);
          fVar51 = fVar71 * fVar51 + in_XMM3._0_4_;
          fVar55 = fVar71 * fVar55 + in_XMM3._4_4_;
          fVar58 = fVar71 * fVar58 + in_XMM3._8_4_;
          fVar60 = fVar71 * fVar60 + in_XMM3._12_4_;
          in_XMM11_Da = fVar74 + fVar51;
          in_XMM11_Db = fVar75 + fVar55;
          in_XMM11_Dc = fVar76 + fVar58;
          in_XMM11_Dd = fVar77 + fVar60;
          auVar48._4_4_ = in_XMM11_Db;
          auVar48._0_4_ = in_XMM11_Da;
          auVar48._8_4_ = in_XMM11_Dc;
          auVar48._12_4_ = in_XMM11_Dd;
          auVar68 = minps(auVar68,auVar48);
          auVar10._4_4_ = in_XMM11_Db;
          auVar10._0_4_ = in_XMM11_Da;
          auVar10._8_4_ = in_XMM11_Dc;
          auVar10._12_4_ = in_XMM11_Dd;
          auVar47 = maxps(auVar47,auVar10);
          fVar62 = fVar66 * fVar62;
          fVar64 = fVar66 * fVar64;
          fVar65 = fVar66 * fVar65;
          fVar66 = fVar66 * fVar50;
          auVar23._0_4_ = fVar21 + fVar62;
          auVar23._4_4_ = fVar26 + fVar64;
          auVar23._8_4_ = fVar28 + fVar65;
          auVar23._12_4_ = fVar31 + fVar66;
          auVar68 = minps(auVar68,auVar23);
          auVar47 = maxps(auVar47,auVar23);
          auVar33._0_4_ = fVar32 + fVar62;
          auVar33._4_4_ = fVar35 + fVar64;
          auVar33._8_4_ = fVar36 + fVar65;
          auVar33._12_4_ = fVar37 + fVar66;
          auVar68 = minps(auVar68,auVar33);
          auVar47 = maxps(auVar47,auVar33);
          in_XMM10._0_4_ = fVar67 + fVar62;
          in_XMM10._4_4_ = fVar69 + fVar64;
          in_XMM10._8_4_ = fVar70 + fVar65;
          in_XMM10._12_4_ = fVar72 + fVar66;
          auVar68 = minps(auVar68,in_XMM10);
          auVar47 = maxps(auVar47,in_XMM10);
          in_XMM9._0_4_ = fVar62 + fVar51;
          in_XMM9._4_4_ = fVar64 + fVar55;
          in_XMM9._8_4_ = fVar65 + fVar58;
          in_XMM9._12_4_ = fVar66 + fVar60;
          in_XMM6 = minps(auVar68,in_XMM9);
          in_XMM7 = maxps(auVar47,in_XMM9);
          in_XMM13_Da = (float)local_188;
          in_XMM13_Db = local_188._4_4_;
          in_XMM13_Dc = (float)uStack_180;
          in_XMM13_Dd = uStack_180._4_4_;
        }
        auVar24._0_4_ = in_XMM7._0_4_ + in_XMM6._0_4_;
        auVar24._4_4_ = in_XMM7._4_4_ + in_XMM6._4_4_;
        auVar24._8_4_ = in_XMM7._8_4_ + in_XMM6._8_4_;
        auVar24._12_4_ = in_XMM7._12_4_ + in_XMM6._12_4_;
        _local_1b8 = minps(_local_1b8,auVar24);
        auVar38 = maxps(auVar38,auVar24);
        uVar14 = uVar14 + 1;
      } while (uVar13 != uVar14);
      uVar13 = (ulong)current->_end;
    }
    else {
      uStack_1b0 = 0x7f8000007f800000;
      local_1b8 = (undefined1  [8])0x7f8000007f800000;
    }
    if (uVar22 < (uint)uVar13) {
      auVar39._0_4_ = auVar38._0_4_ - (float)local_1b8._0_4_;
      auVar39._4_4_ = auVar38._4_4_ - (float)local_1b8._4_4_;
      auVar39._8_4_ = auVar38._8_4_ - (float)uStack_1b0;
      auVar39._12_4_ = auVar38._12_4_ - uStack_1b0._4_4_;
      auVar38 = rcpps(in_XMM3,auVar39);
      fVar55 = auVar38._0_4_;
      fVar51 = auVar38._4_4_;
      fVar60 = auVar38._8_4_;
      fVar58 = auVar38._12_4_;
      fVar55 = (float)((uint)(((1.0 - auVar39._0_4_ * fVar55) * fVar55 + fVar55) * 1013.76) &
                      -(uint)(1e-19 < auVar39._0_4_));
      fVar51 = (float)((uint)(((1.0 - auVar39._4_4_ * fVar51) * fVar51 + fVar51) * 1013.76) &
                      -(uint)(1e-19 < auVar39._4_4_));
      fVar60 = (float)((uint)(((1.0 - auVar39._8_4_ * fVar60) * fVar60 + fVar60) * 1013.76) &
                      -(uint)(1e-19 < auVar39._8_4_));
      local_188 = (BBox<embree::Vec3fa> *)CONCAT44(fVar51,fVar55);
      uStack_180 = (anon_class_16_2_ed117de8_conflict24 *)
                   CONCAT44((uint)(((1.0 - auVar39._12_4_ * fVar58) * fVar58 + fVar58) * 1013.76) &
                            -(uint)(1e-19 < auVar39._12_4_),fVar60);
      do {
        pIVar5 = this->calculateBounds->mesh;
        uVar13 = (ulong)this->morton[uVar20].field_0.field_0.index;
        pAVar16 = *(Accel **)&(pIVar5->super_Geometry).field_0x58;
        if ((pAVar16 != (Accel *)0x0) ||
           (*(int *)((pIVar5->object_ids).super_RawBufferView.ptr_ofs +
                    (pIVar5->object_ids).super_RawBufferView.stride * uVar13) != -1)) {
          pRVar6 = (pIVar5->l2w_buf).items;
          RVar4 = pRVar6->format;
          if ((pIVar5->super_Geometry).field_8.field_0x1 == '\x01') {
            fVar58 = fStack_1c4;
            if ((int)RVar4 < 0x9244) {
              if (RVar4 == RTC_FORMAT_FLOAT3X4_ROW_MAJOR) {
                pcVar7 = pRVar6->ptr_ofs;
                lVar17 = pRVar6->stride * uVar13;
                local_1c8 = *(float *)(pcVar7 + lVar17);
                local_198 = *(float *)(pcVar7 + lVar17 + 4);
                local_178 = *(float *)(pcVar7 + lVar17 + 8);
                local_1a8 = *(float *)(pcVar7 + lVar17 + 0xc);
                fStack_1c0 = *(float *)(pcVar7 + lVar17 + 0x20);
                fStack_1bc = 0.0;
                fStack_194 = *(float *)(pcVar7 + lVar17 + 0x14);
                fStack_190 = *(float *)(pcVar7 + lVar17 + 0x24);
                fStack_18c = 0.0;
                fStack_174 = *(float *)(pcVar7 + lVar17 + 0x18);
                fStack_170 = *(float *)(pcVar7 + lVar17 + 0x28);
                fStack_16c = 0.0;
                fStack_1a4 = *(float *)(pcVar7 + lVar17 + 0x1c);
                fStack_1a0 = *(float *)(pcVar7 + lVar17 + 0x2c);
                fStack_19c = 0.0;
                fVar58 = *(float *)(pcVar7 + lVar17 + 0x10);
              }
              else if (RVar4 == RTC_FORMAT_FLOAT3X4_COLUMN_MAJOR) {
                pcVar7 = pRVar6->ptr_ofs;
                lVar17 = pRVar6->stride * uVar13;
                local_1c8 = *(float *)(pcVar7 + lVar17);
                fStack_1c0 = (float)((ulong)*(undefined8 *)(pcVar7 + lVar17 + 4) >> 0x20);
                fStack_1bc = 0.0;
                local_198 = *(float *)(pcVar7 + lVar17 + 0xc);
                fStack_194 = (float)*(undefined8 *)(pcVar7 + lVar17 + 0x10);
                fStack_190 = (float)((ulong)*(undefined8 *)(pcVar7 + lVar17 + 0x10) >> 0x20);
                fStack_18c = 0.0;
                local_178 = *(float *)(pcVar7 + lVar17 + 0x18);
                fStack_174 = (float)*(undefined8 *)(pcVar7 + lVar17 + 0x1c);
                fStack_170 = (float)((ulong)*(undefined8 *)(pcVar7 + lVar17 + 0x1c) >> 0x20);
                fStack_16c = 0.0;
                local_1a8 = *(float *)(pcVar7 + lVar17 + 0x24);
                fStack_1a4 = (float)*(undefined8 *)(pcVar7 + lVar17 + 0x28);
                fStack_1a0 = (float)((ulong)*(undefined8 *)(pcVar7 + lVar17 + 0x28) >> 0x20);
                fStack_19c = 0.0;
                fVar58 = (float)*(undefined8 *)(pcVar7 + lVar17 + 4);
              }
            }
            else if (RVar4 == RTC_FORMAT_QUATERNION_DECOMPOSITION) {
              pcVar7 = pRVar6->ptr_ofs;
              lVar17 = pRVar6->stride * uVar13;
              local_178 = *(float *)(pcVar7 + lVar17 + 0x10);
              fStack_174 = *(float *)((long)(pcVar7 + lVar17 + 0x10) + 4);
              local_1c8 = *(float *)(pcVar7 + lVar17);
              fStack_194 = *(float *)(pcVar7 + lVar17 + 4);
              fStack_170 = *(float *)(pcVar7 + lVar17 + 8);
              local_198 = *(float *)(pcVar7 + lVar17 + 0xc);
              local_1a8 = *(float *)(pcVar7 + lVar17 + 0x18);
              fStack_19c = *(float *)(pcVar7 + lVar17 + 0x24);
              fStack_1bc = *(float *)(pcVar7 + lVar17 + 0x28);
              fVar58 = *(float *)(pcVar7 + lVar17 + 0x2c);
              fVar62 = *(float *)(pcVar7 + lVar17 + 0x30);
              fVar65 = fVar62 * fVar62 +
                       fVar58 * fVar58 + fStack_19c * fStack_19c + fStack_1bc * fStack_1bc;
              auVar38 = rsqrtss(ZEXT416((uint)fVar65),ZEXT416((uint)fVar65));
              fVar64 = auVar38._0_4_;
              fVar64 = fVar64 * fVar64 * fVar65 * -0.5 * fVar64 + fVar64 * 1.5;
              fStack_19c = fStack_19c * fVar64;
              fStack_1bc = fStack_1bc * fVar64;
              fStack_18c = fVar58 * fVar64;
              fStack_16c = fVar64 * fVar62;
              fVar58 = (float)*(undefined8 *)(pcVar7 + lVar17 + 0x34);
              fStack_1c4 = (float)((ulong)*(undefined8 *)(pcVar7 + lVar17 + 0x34) >> 0x20);
              fStack_190 = *(float *)(pcVar7 + lVar17 + 0x3c);
              fStack_1a4 = (float)*(undefined8 *)(pcVar7 + lVar17 + 0x1c);
              fStack_1a0 = (float)((ulong)*(undefined8 *)(pcVar7 + lVar17 + 0x1c) >> 0x20);
              fStack_1c0 = fStack_1c4;
            }
            else if (RVar4 == RTC_FORMAT_FLOAT4X4_COLUMN_MAJOR) {
              pcVar7 = pRVar6->ptr_ofs;
              lVar17 = pRVar6->stride * uVar13;
              pfVar1 = (float *)(pcVar7 + lVar17);
              local_1c8 = *pfVar1;
              fVar58 = pfVar1[1];
              fStack_1c0 = pfVar1[2];
              fStack_1bc = pfVar1[3];
              pfVar1 = (float *)(pcVar7 + lVar17 + 0x10);
              local_198 = *pfVar1;
              fStack_194 = pfVar1[1];
              fStack_190 = pfVar1[2];
              fStack_18c = pfVar1[3];
              pfVar1 = (float *)(pcVar7 + lVar17 + 0x20);
              local_178 = *pfVar1;
              fStack_174 = pfVar1[1];
              fStack_170 = pfVar1[2];
              fStack_16c = pfVar1[3];
              pfVar1 = (float *)(pcVar7 + lVar17 + 0x30);
              local_1a8 = *pfVar1;
              fStack_1a4 = pfVar1[1];
              fStack_1a0 = pfVar1[2];
              fStack_19c = pfVar1[3];
            }
            fStack_1c4 = fVar58;
            local_158._4_4_ = fStack_1c0;
            local_158._0_4_ = fVar58;
            local_158._8_4_ = fStack_190;
            local_158._12_4_ = 0;
            fVar32 = fStack_1bc * fStack_18c + fStack_16c * fStack_19c;
            fVar21 = fStack_1bc * fStack_18c - fStack_16c * fStack_19c;
            fVar50 = fStack_19c * fStack_19c + fStack_1bc * fStack_1bc + -fStack_18c * fStack_18c +
                     -fStack_16c * fStack_16c;
            fVar65 = fStack_19c * fStack_19c - fStack_1bc * fStack_1bc;
            fVar64 = fStack_18c * fStack_18c + fVar65 + -fStack_16c * fStack_16c;
            fVar35 = fStack_1bc * fStack_16c - fStack_18c * fStack_19c;
            fVar36 = fStack_18c * fStack_19c + fStack_1bc * fStack_16c;
            fVar62 = fStack_18c * fStack_16c + fStack_1bc * fStack_19c;
            fVar37 = fStack_18c * fStack_16c - fStack_1bc * fStack_19c;
            fVar65 = fStack_16c * fStack_16c + fVar65 + -fStack_18c * fStack_18c;
            fVar32 = fVar32 + fVar32;
            fVar35 = fVar35 + fVar35;
            fVar21 = fVar21 + fVar21;
            fVar62 = fVar62 + fVar62;
            fVar36 = fVar36 + fVar36;
            fVar37 = fVar37 + fVar37;
            local_168 = fVar50 * 1.0 + fVar32 * 0.0 + fVar35 * 0.0;
            fStack_164 = fVar50 * 0.0 + fVar32 * 1.0 + fVar35 * 0.0;
            fStack_160 = fVar50 * 0.0 + fVar32 * 0.0 + fVar35 * 1.0;
            fStack_15c = fVar50 * 0.0 + fVar32 * 0.0 + fVar35 * 0.0;
            fVar77 = fVar21 * 1.0 + fVar64 * 0.0 + fVar62 * 0.0;
            fVar67 = fVar21 * 0.0 + fVar64 * 1.0 + fVar62 * 0.0;
            fVar29 = fVar21 * 0.0 + fVar64 * 0.0 + fVar62 * 1.0;
            fVar69 = fVar21 * 0.0 + fVar64 * 0.0 + fVar62 * 0.0;
            fVar31 = fVar36 * 1.0 + fVar37 * 0.0 + fVar65 * 0.0;
            fVar66 = fVar36 * 0.0 + fVar37 * 1.0 + fVar65 * 0.0;
            fVar71 = fVar36 * 0.0 + fVar37 * 0.0 + fVar65 * 1.0;
            fVar73 = fVar36 * 0.0 + fVar37 * 0.0 + fVar65 * 0.0;
            fVar62 = local_1c8 * local_168 + fVar77 * 0.0 + fVar31 * 0.0;
            fVar65 = local_1c8 * fStack_164 + fVar67 * 0.0 + fVar66 * 0.0;
            fVar50 = local_1c8 * fStack_160 + fVar29 * 0.0 + fVar71 * 0.0;
            fVar64 = local_1c8 * fStack_15c + fVar69 * 0.0 + fVar73 * 0.0;
            fVar58 = local_1a8 * local_168 + fStack_1a4 * fVar77 + fStack_1a0 * fVar31 +
                     fVar58 + 0.0;
            fVar32 = local_1a8 * fStack_164 + fStack_1a4 * fVar67 + fStack_1a0 * fVar66 +
                     fStack_1c0 + 0.0;
            fVar35 = local_1a8 * fStack_160 + fStack_1a4 * fVar29 + fStack_1a0 * fVar71 +
                     fStack_190 + 0.0;
            fVar36 = local_1a8 * fStack_15c + fStack_1a4 * fVar69 + fStack_1a0 * fVar73 + 0.0;
            fVar37 = local_178 * local_168 + fStack_174 * fVar77 + fStack_170 * fVar31;
            fVar21 = local_178 * fStack_164 + fStack_174 * fVar67 + fStack_170 * fVar66;
            fVar26 = local_178 * fStack_160 + fStack_174 * fVar29 + fStack_170 * fVar71;
            fVar28 = local_178 * fStack_15c + fStack_174 * fVar69 + fStack_170 * fVar73;
            fVar31 = local_198 * local_168 + fStack_194 * fVar77 + fVar31 * 0.0;
            fVar66 = local_198 * fStack_164 + fStack_194 * fVar67 + fVar66 * 0.0;
            fVar71 = local_198 * fStack_160 + fStack_194 * fVar29 + fVar71 * 0.0;
            fVar73 = local_198 * fStack_15c + fStack_194 * fVar69 + fVar73 * 0.0;
          }
          else {
            fVar62 = in_XMM13_Da;
            fVar65 = in_XMM13_Db;
            fVar50 = in_XMM13_Dc;
            fVar64 = in_XMM13_Dd;
            fVar58 = in_XMM5_Da;
            fVar32 = in_XMM5_Db;
            fVar35 = in_XMM5_Dc;
            fVar36 = in_XMM5_Dd;
            fVar37 = in_XMM11_Da;
            fVar21 = in_XMM11_Db;
            fVar26 = in_XMM11_Dc;
            fVar28 = in_XMM11_Dd;
            fVar31 = in_XMM15_Da;
            fVar66 = in_XMM15_Db;
            fVar71 = in_XMM15_Dc;
            fVar73 = in_XMM15_Dd;
            if ((int)RVar4 < 0x9244) {
              if (RVar4 == RTC_FORMAT_FLOAT3X4_ROW_MAJOR) {
                pcVar7 = pRVar6->ptr_ofs;
                lVar17 = pRVar6->stride * uVar13;
                in_XMM15_Da = *(float *)(pcVar7 + lVar17 + 4);
                in_XMM11_Da = *(float *)(pcVar7 + lVar17 + 8);
                in_XMM5_Da = *(float *)(pcVar7 + lVar17 + 0xc);
                in_XMM15_Db = *(float *)(pcVar7 + lVar17 + 0x14);
                in_XMM15_Dc = *(float *)(pcVar7 + lVar17 + 0x24);
                in_XMM15_Dd = 0.0;
                in_XMM11_Db = *(float *)(pcVar7 + lVar17 + 0x18);
                in_XMM11_Dc = *(float *)(pcVar7 + lVar17 + 0x28);
                in_XMM11_Dd = 0.0;
                in_XMM5_Db = *(float *)(pcVar7 + lVar17 + 0x1c);
                in_XMM5_Dc = *(float *)(pcVar7 + lVar17 + 0x2c);
                in_XMM5_Dd = 0.0;
                fVar62 = *(float *)(pcVar7 + lVar17);
                fVar65 = *(float *)(pcVar7 + lVar17 + 0x10);
                fVar50 = *(float *)(pcVar7 + lVar17 + 0x20);
                fVar64 = 0.0;
                in_XMM13_Da = *(float *)(pcVar7 + lVar17);
                in_XMM13_Db = *(float *)(pcVar7 + lVar17 + 0x10);
                in_XMM13_Dc = *(float *)(pcVar7 + lVar17 + 0x20);
                in_XMM13_Dd = 0.0;
                fVar58 = in_XMM5_Da;
                fVar32 = in_XMM5_Db;
                fVar35 = in_XMM5_Dc;
                fVar36 = in_XMM5_Dd;
                fVar37 = in_XMM11_Da;
                fVar21 = in_XMM11_Db;
                fVar26 = in_XMM11_Dc;
                fVar28 = in_XMM11_Dd;
                fVar31 = in_XMM15_Da;
                fVar66 = in_XMM15_Db;
                fVar71 = in_XMM15_Dc;
                fVar73 = in_XMM15_Dd;
              }
              else if (RVar4 == RTC_FORMAT_FLOAT3X4_COLUMN_MAJOR) {
                pcVar7 = pRVar6->ptr_ofs;
                lVar17 = pRVar6->stride * uVar13;
                fVar65 = (float)*(undefined8 *)(pcVar7 + lVar17 + 4);
                fVar50 = (float)((ulong)*(undefined8 *)(pcVar7 + lVar17 + 4) >> 0x20);
                in_XMM15_Db = *(float *)(pcVar7 + lVar17 + 0x18);
                in_XMM15_Dc = *(float *)(pcVar7 + lVar17 + 0x1c);
                in_XMM15_Da = *(float *)(pcVar7 + lVar17 + 0xc);
                in_XMM15_Dd = 0.0;
                in_XMM11_Da = *(float *)(pcVar7 + lVar17 + 0x18);
                in_XMM11_Db = (float)*(undefined8 *)(pcVar7 + lVar17 + 0x1c);
                in_XMM11_Dc = (float)((ulong)*(undefined8 *)(pcVar7 + lVar17 + 0x1c) >> 0x20);
                in_XMM11_Dd = 0.0;
                in_XMM5_Da = *(float *)(pcVar7 + lVar17 + 0x24);
                in_XMM5_Db = (float)*(undefined8 *)(pcVar7 + lVar17 + 0x28);
                in_XMM5_Dc = (float)((ulong)*(undefined8 *)(pcVar7 + lVar17 + 0x28) >> 0x20);
                in_XMM5_Dd = 0.0;
                fVar62 = *(float *)(pcVar7 + lVar17);
                fVar64 = 0.0;
                in_XMM13_Da = *(float *)(pcVar7 + lVar17);
                in_XMM13_Db = fVar65;
                in_XMM13_Dc = fVar50;
                in_XMM13_Dd = 0.0;
                fVar58 = in_XMM5_Da;
                fVar32 = in_XMM5_Db;
                fVar35 = in_XMM5_Dc;
                fVar36 = in_XMM5_Dd;
                fVar37 = in_XMM11_Da;
                fVar21 = in_XMM11_Db;
                fVar26 = in_XMM11_Dc;
                fVar28 = in_XMM11_Dd;
                fVar31 = in_XMM15_Da;
                fVar66 = in_XMM15_Db;
                fVar71 = in_XMM15_Dc;
                fVar73 = in_XMM15_Dd;
              }
            }
            else if (RVar4 == RTC_FORMAT_QUATERNION_DECOMPOSITION) {
              pcVar7 = pRVar6->ptr_ofs;
              lVar17 = pRVar6->stride * uVar13;
              in_XMM11_Da = (float)*(undefined8 *)(pcVar7 + lVar17 + 0x10);
              in_XMM11_Db = (float)((ulong)*(undefined8 *)(pcVar7 + lVar17 + 0x10) >> 0x20);
              fVar62 = *(float *)(pcVar7 + lVar17);
              in_XMM15_Db = *(float *)(pcVar7 + lVar17 + 4);
              in_XMM11_Dc = *(float *)(pcVar7 + lVar17 + 8);
              in_XMM15_Da = *(float *)(pcVar7 + lVar17 + 0xc);
              fVar65 = (float)*(undefined8 *)(pcVar7 + lVar17 + 0x34);
              fVar50 = (float)((ulong)*(undefined8 *)(pcVar7 + lVar17 + 0x34) >> 0x20);
              in_XMM5_Da = *(float *)(pcVar7 + lVar17 + 0x18);
              in_XMM5_Db = (float)*(undefined8 *)(pcVar7 + lVar17 + 0x1c);
              in_XMM5_Dc = (float)((ulong)*(undefined8 *)(pcVar7 + lVar17 + 0x1c) >> 0x20);
              fVar58 = *(float *)(pcVar7 + lVar17 + 0x24);
              fVar64 = *(float *)(pcVar7 + lVar17 + 0x28);
              fVar32 = *(float *)(pcVar7 + lVar17 + 0x2c);
              fVar35 = *(float *)(pcVar7 + lVar17 + 0x30);
              fVar37 = fVar35 * fVar35 + fVar32 * fVar32 + fVar58 * fVar58 + fVar64 * fVar64;
              auVar38 = rsqrtss(ZEXT416((uint)fVar37),ZEXT416((uint)fVar37));
              fVar36 = auVar38._0_4_;
              fVar36 = fVar36 * fVar36 * fVar37 * -0.5 * fVar36 + fVar36 * 1.5;
              in_XMM5_Dd = fVar58 * fVar36;
              fVar64 = fVar64 * fVar36;
              in_XMM15_Dd = fVar32 * fVar36;
              in_XMM11_Dd = fVar36 * fVar35;
              in_XMM15_Dc = *(float *)(pcVar7 + lVar17 + 0x3c);
              in_XMM13_Da = fVar62;
              in_XMM13_Db = fVar65;
              in_XMM13_Dc = fVar50;
              in_XMM13_Dd = fVar64;
              fVar58 = in_XMM5_Da;
              fVar32 = in_XMM5_Db;
              fVar35 = in_XMM5_Dc;
              fVar36 = in_XMM5_Dd;
              fVar37 = in_XMM11_Da;
              fVar21 = in_XMM11_Db;
              fVar26 = in_XMM11_Dc;
              fVar28 = in_XMM11_Dd;
              fVar31 = in_XMM15_Da;
              fVar66 = in_XMM15_Db;
              fVar71 = in_XMM15_Dc;
              fVar73 = in_XMM15_Dd;
            }
            else if (RVar4 == RTC_FORMAT_FLOAT4X4_COLUMN_MAJOR) {
              pcVar7 = pRVar6->ptr_ofs;
              lVar17 = pRVar6->stride * uVar13;
              pfVar1 = (float *)(pcVar7 + lVar17);
              fVar62 = *pfVar1;
              fVar65 = pfVar1[1];
              fVar50 = pfVar1[2];
              fVar64 = pfVar1[3];
              pfVar1 = (float *)(pcVar7 + lVar17 + 0x10);
              in_XMM15_Da = *pfVar1;
              in_XMM15_Db = pfVar1[1];
              in_XMM15_Dc = pfVar1[2];
              in_XMM15_Dd = pfVar1[3];
              pfVar1 = (float *)(pcVar7 + lVar17 + 0x20);
              in_XMM11_Da = *pfVar1;
              in_XMM11_Db = pfVar1[1];
              in_XMM11_Dc = pfVar1[2];
              in_XMM11_Dd = pfVar1[3];
              pfVar1 = (float *)(pcVar7 + lVar17 + 0x30);
              in_XMM5_Da = *pfVar1;
              in_XMM5_Db = pfVar1[1];
              in_XMM5_Dc = pfVar1[2];
              in_XMM5_Dd = pfVar1[3];
              in_XMM13_Da = fVar62;
              in_XMM13_Db = fVar65;
              in_XMM13_Dc = fVar50;
              in_XMM13_Dd = fVar64;
              fVar58 = in_XMM5_Da;
              fVar32 = in_XMM5_Db;
              fVar35 = in_XMM5_Dc;
              fVar36 = in_XMM5_Dd;
              fVar37 = in_XMM11_Da;
              fVar21 = in_XMM11_Db;
              fVar26 = in_XMM11_Dc;
              fVar28 = in_XMM11_Dd;
              fVar31 = in_XMM15_Da;
              fVar66 = in_XMM15_Db;
              fVar71 = in_XMM15_Dc;
              fVar73 = in_XMM15_Dd;
            }
          }
          if (pAVar16 == (Accel *)0x0) {
            pAVar16 = pIVar5->objects
                      [*(uint *)((pIVar5->object_ids).super_RawBufferView.ptr_ofs +
                                uVar13 * (pIVar5->object_ids).super_RawBufferView.stride)];
          }
          auVar68 = minps((undefined1  [16])(pAVar16->super_AccelData).bounds.bounds0.lower.field_0,
                          (undefined1  [16])(pAVar16->super_AccelData).bounds.bounds1.lower.field_0)
          ;
          auVar38 = maxps((undefined1  [16])(pAVar16->super_AccelData).bounds.bounds0.upper.field_0,
                          (undefined1  [16])(pAVar16->super_AccelData).bounds.bounds1.upper.field_0)
          ;
          fVar75 = auVar68._0_4_;
          fVar56 = auVar68._4_4_;
          fVar77 = auVar68._8_4_;
          fVar52 = fVar77 * fVar37 + fVar58;
          fVar57 = fVar77 * fVar21 + fVar32;
          fVar59 = fVar77 * fVar26 + fVar35;
          fVar61 = fVar77 * fVar28 + fVar36;
          fVar77 = fVar56 * fVar31 + fVar52;
          fVar67 = fVar56 * fVar66 + fVar57;
          fVar29 = fVar56 * fVar71 + fVar59;
          fVar69 = fVar56 * fVar73 + fVar61;
          fVar70 = fVar75 * fVar62;
          fVar72 = fVar75 * fVar65;
          fVar74 = fVar75 * fVar50;
          fVar75 = fVar75 * fVar64;
          fVar76 = fVar70 + fVar77;
          fVar43 = fVar72 + fVar67;
          fVar44 = fVar74 + fVar29;
          fVar45 = fVar75 + fVar69;
          auVar8._4_4_ = fVar43;
          auVar8._0_4_ = fVar76;
          auVar8._8_4_ = fVar44;
          auVar8._12_4_ = fVar45;
          auVar68 = minps(_DAT_01f7a9f0,auVar8);
          auVar9._4_4_ = fVar43;
          auVar9._0_4_ = fVar76;
          auVar9._8_4_ = fVar44;
          auVar9._12_4_ = fVar45;
          auVar47 = maxps(_DAT_01f7aa00,auVar9);
          fVar76 = auVar38._0_4_;
          fVar43 = auVar38._4_4_;
          fVar44 = auVar38._8_4_;
          fVar58 = fVar44 * fVar37 + fVar58;
          fVar32 = fVar44 * fVar21 + fVar32;
          fVar35 = fVar44 * fVar26 + fVar35;
          fVar36 = fVar44 * fVar28 + fVar36;
          fVar37 = fVar56 * fVar31 + fVar58;
          fVar21 = fVar56 * fVar66 + fVar32;
          fVar26 = fVar56 * fVar71 + fVar35;
          fVar28 = fVar56 * fVar73 + fVar36;
          auVar40._0_4_ = fVar70 + fVar37;
          auVar40._4_4_ = fVar72 + fVar21;
          auVar40._8_4_ = fVar74 + fVar26;
          auVar40._12_4_ = fVar75 + fVar28;
          auVar38 = minps(auVar68,auVar40);
          auVar68 = maxps(auVar47,auVar40);
          fVar52 = fVar52 + fVar43 * fVar31;
          fVar57 = fVar57 + fVar43 * fVar66;
          fVar59 = fVar59 + fVar43 * fVar71;
          fVar61 = fVar61 + fVar43 * fVar73;
          auVar46._0_4_ = fVar70 + fVar52;
          auVar46._4_4_ = fVar72 + fVar57;
          auVar46._8_4_ = fVar74 + fVar59;
          auVar46._12_4_ = fVar75 + fVar61;
          auVar38 = minps(auVar38,auVar46);
          auVar68 = maxps(auVar68,auVar46);
          fVar58 = fVar43 * fVar31 + fVar58;
          fVar32 = fVar43 * fVar66 + fVar32;
          fVar35 = fVar43 * fVar71 + fVar35;
          fVar36 = fVar43 * fVar73 + fVar36;
          auVar34._0_4_ = fVar70 + fVar58;
          auVar34._4_4_ = fVar72 + fVar32;
          auVar34._8_4_ = fVar74 + fVar35;
          auVar34._12_4_ = fVar75 + fVar36;
          auVar38 = minps(auVar38,auVar34);
          auVar68 = maxps(auVar68,auVar34);
          fVar62 = fVar76 * fVar62;
          fVar65 = fVar76 * fVar65;
          fVar50 = fVar76 * fVar50;
          fVar76 = fVar76 * fVar64;
          auVar25._0_4_ = fVar77 + fVar62;
          auVar25._4_4_ = fVar67 + fVar65;
          auVar25._8_4_ = fVar29 + fVar50;
          auVar25._12_4_ = fVar69 + fVar76;
          auVar38 = minps(auVar38,auVar25);
          auVar68 = maxps(auVar68,auVar25);
          auVar42._0_4_ = fVar37 + fVar62;
          auVar42._4_4_ = fVar21 + fVar65;
          auVar42._8_4_ = fVar26 + fVar50;
          auVar42._12_4_ = fVar28 + fVar76;
          auVar38 = minps(auVar38,auVar42);
          auVar68 = maxps(auVar68,auVar42);
          auVar54._0_4_ = fVar52 + fVar62;
          auVar54._4_4_ = fVar57 + fVar65;
          auVar54._8_4_ = fVar59 + fVar50;
          auVar54._12_4_ = fVar61 + fVar76;
          auVar38 = minps(auVar38,auVar54);
          auVar68 = maxps(auVar68,auVar54);
          auVar49._0_4_ = fVar62 + fVar58;
          auVar49._4_4_ = fVar65 + fVar32;
          auVar49._8_4_ = fVar50 + fVar35;
          auVar49._12_4_ = fVar76 + fVar36;
          in_XMM9 = minps(auVar38,auVar49);
          in_XMM10 = maxps(auVar68,auVar49);
        }
        uVar22 = (uint)(((in_XMM10._0_4_ + in_XMM9._0_4_) - (float)local_1b8._0_4_) * fVar55);
        uVar27 = (uint)(((in_XMM10._4_4_ + in_XMM9._4_4_) - (float)local_1b8._4_4_) * fVar51);
        uVar30 = (uint)(((in_XMM10._8_4_ + in_XMM9._8_4_) - (float)uStack_1b0) * fVar60);
        uVar22 = (uVar22 << 0x10 | uVar22) & 0x30000ff;
        uVar22 = (uVar22 << 8 | uVar22) & 0x300f00f;
        uVar27 = (uVar27 << 0x10 | uVar27) & 0x30000ff;
        uVar19 = (uVar27 << 8 | uVar27) & 0x300f00f;
        uVar27 = (uVar30 << 0x10 | uVar30) & 0x30000ff;
        uVar27 = (uVar27 << 8 | uVar27) & 0x300f00f;
        this->morton[uVar20].field_0.field_0.code =
             ((uVar27 << 4 | uVar27) & 0x30c30c3) * 0x14 & 0x24924924 |
             ((uVar19 << 4 | uVar19) & 0x30c30c3) * 10 & 0x12492492 |
             ((uVar22 << 4 | uVar22) & 0x30c30c3) * 5 & 0x9249249;
        uVar20 = uVar20 + 1;
        uVar13 = (ulong)current->_end;
      } while (uVar20 < uVar13);
    }
    uVar22 = current->_begin;
    if (uVar22 != (uint)uVar13) {
      pBVar2 = this->morton + uVar13;
      pBVar3 = this->morton + uVar22;
      uVar13 = (long)(uVar13 * 8 + (ulong)uVar22 * -8) >> 3;
      lVar17 = 0x3f;
      if (uVar13 != 0) {
        for (; uVar13 >> lVar17 == 0; lVar17 = lVar17 + -1) {
        }
      }
      std::
      __introsort_loop<embree::sse2::BVHBuilderMorton::BuildPrim*,long,__gnu_cxx::__ops::_Iter_less_iter>
                (pBVar3,pBVar2,((uint)lVar17 ^ 0x3f) * 2 ^ 0x7e);
      std::
      __final_insertion_sort<embree::sse2::BVHBuilderMorton::BuildPrim*,__gnu_cxx::__ops::_Iter_less_iter>
                (pBVar3,pBVar2);
      return;
    }
  }
  else {
    local_58._0_8_ = 0x7f8000007f800000;
    local_58._8_8_ = 0x7f8000007f800000;
    local_48 = 0xff800000ff800000;
    uStack_40 = 0xff800000ff800000;
    local_d8.my_version = proxy_support;
    local_d8.my_traits = (context_traits)0x4;
    local_d8.my_node.my_prev_node = (intrusive_list_node *)0x0;
    local_d8.my_node.my_next_node = (intrusive_list_node *)0x0;
    local_d8.my_name = CUSTOM_CTX;
    local_140.this =
         (BuilderT<embree::BVHNodeRecord<embree::NodeRefPtr<4>_>,_embree::FastAllocator::CachedAllocator,_embree::BVHN<4>::CreateAlloc,_embree::AABBNode_t<embree::NodeRefPtr<4>,_4>::Create,_embree::sse2::SetBVHNBounds<4>,_embree::sse2::CreateMortonLeaf<4,_embree::TriangleM<4>_>,_embree::sse2::CalculateMeshBounds<embree::TriangleMesh>,_embree::Scene::BuildProgressMonitorInterface>
          *)this;
    tbb::detail::r1::initialize(&local_d8);
    local_138._4_4_ = uVar22;
    local_138._0_4_ = uVar27;
    local_130 = (lambda_reduce_body<tbb::detail::d1::blocked_range<unsigned_int>,_embree::BBox<embree::Vec3fa>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_embree[P]embree_kernels_bvh____builders_______common_algorithms_parallel_reduce_h:59:7),_const_embree::BBox<embree::Vec3fa>_(const_embree::BBox<embree::Vec3fa>_&,_const_embree::BBox<embree::Vec3fa>_&)>
                 *)0x400;
    local_118.my_real_body = &local_128;
    local_128.reduction = BBox<embree::Vec3fa>::merge;
    local_128.func = &local_140;
    local_118.my_reduction = BBox<embree::Vec3fa>::merge;
    local_118.my_value.lower.field_0._0_8_ = (BBox<embree::Vec3fa> *)0x7f8000007f800000;
    local_118.my_value.lower.field_0._8_8_ =
         (anon_class_16_2_ed117de8_conflict24 *)0x7f8000007f800000;
    local_118.my_value.upper.field_0._0_8_ = 0xff800000ff800000;
    local_118.my_value.upper.field_0._8_8_ = 0xff800000ff800000;
    local_118.my_identity_element = (BBox<embree::Vec3fa> *)&local_58;
    tbb::detail::d1::
    start_reduce<tbb::detail::d1::blocked_range<unsigned_int>,_tbb::detail::d1::lambda_reduce_body<tbb::detail::d1::blocked_range<unsigned_int>,_embree::BBox<embree::Vec3fa>,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/embree[P]embree/kernels/bvh/../builders/../../common/algorithms/parallel_reduce.h:59:7),_const_embree::BBox<embree::Vec3fa>_(const_embree::BBox<embree::Vec3fa>_&,_const_embree::BBox<embree::Vec3fa>_&)>,_const_tbb::detail::d1::auto_partitioner>
    ::run((blocked_range<unsigned_int> *)&local_138,&local_118,&local_1c9,&local_d8);
    local_188 = (BBox<embree::Vec3fa> *)local_118.my_value.lower.field_0._0_8_;
    uStack_180 = (anon_class_16_2_ed117de8_conflict24 *)local_118.my_value.lower.field_0._8_8_;
    uStack_1b0 = local_118.my_value.upper.field_0._8_8_;
    local_1b8 = (undefined1  [8])local_118.my_value.upper.field_0._0_8_;
    cVar11 = tbb::detail::r1::is_group_execution_cancelled(&local_d8);
    if (cVar11 != '\0') {
      prVar12 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::runtime_error::runtime_error(prVar12,"task cancelled");
      __cxa_throw(prVar12,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
    tbb::detail::r1::destroy(&local_d8);
    auVar38._8_8_ = extraout_XMM1_Qb;
    auVar38._0_8_ = extraout_XMM1_Qa;
    local_118.my_identity_element = local_188;
    local_118.my_real_body = uStack_180;
    auVar68._0_4_ = (float)local_1b8._0_4_ - (float)local_188;
    auVar68._4_4_ = (float)local_1b8._4_4_ - local_188._4_4_;
    auVar68._8_4_ = (float)uStack_1b0 - (float)uStack_180;
    auVar68._12_4_ = uStack_1b0._4_4_ - uStack_180._4_4_;
    auVar38 = rcpps(auVar38,auVar68);
    fVar55 = auVar38._0_4_;
    fVar51 = auVar38._4_4_;
    fVar60 = auVar38._8_4_;
    fVar58 = auVar38._12_4_;
    local_118._24_4_ =
         (uint)(((1.0 - auVar68._8_4_ * fVar60) * fVar60 + fVar60) * 1013.76) &
         -(uint)(1e-19 < auVar68._8_4_);
    local_118._28_4_ =
         (uint)(((1.0 - auVar68._12_4_ * fVar58) * fVar58 + fVar58) * 1013.76) &
         -(uint)(1e-19 < auVar68._12_4_);
    local_118.my_reduction =
         (_func_BBox<embree::Vec3fa>_BBox<embree::Vec3fa>_ptr_BBox<embree::Vec3fa>_ptr *)
         CONCAT44((uint)(((1.0 - auVar68._4_4_ * fVar51) * fVar51 + fVar51) * 1013.76) &
                  -(uint)(1e-19 < auVar68._4_4_),
                  (uint)(((1.0 - auVar68._0_4_ * fVar55) * fVar55 + fVar55) * 1013.76) &
                  -(uint)(1e-19 < auVar68._0_4_));
    local_d8.my_version = proxy_support;
    local_d8.my_traits = (context_traits)0x4;
    local_d8.my_node.my_prev_node = (intrusive_list_node *)0x0;
    local_d8.my_node.my_next_node = (intrusive_list_node *)0x0;
    local_d8.my_name = CUSTOM_CTX;
    uStack_1b0 = 0;
    local_1b8._0_4_ = current->_begin;
    local_1b8._4_4_ = current->_end;
    local_138 = this;
    local_130 = &local_118;
    tbb::detail::r1::initialize(&local_d8);
    local_58._0_8_ = CONCAT44(local_1b8._0_4_,local_1b8._4_4_);
    local_58._8_8_ = 0x400;
    local_128.reduction =
         (_func_BBox<embree::Vec3fa>_BBox<embree::Vec3fa>_ptr_BBox<embree::Vec3fa>_ptr *)&local_138;
    tbb::detail::d1::
    start_for<tbb::detail::d1::blocked_range<unsigned_int>,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/embree[P]embree/kernels/bvh/../../common/algorithms/parallel_for.h:70:73),_const_tbb::detail::d1::auto_partitioner>
    ::run((blocked_range<unsigned_int> *)&local_58.field_1,(anon_class_8_1_898bcfc2 *)&local_128,
          &local_1c9,&local_d8);
    cVar11 = tbb::detail::r1::is_group_execution_cancelled(&local_d8);
    if (cVar11 != '\0') {
      prVar12 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::runtime_error::runtime_error(prVar12,"task cancelled");
      __cxa_throw(prVar12,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
    tbb::detail::r1::destroy(&local_d8);
    tbb::detail::d1::
    parallel_sort<embree::sse2::BVHBuilderMorton::BuildPrim*,std::less<embree::sse2::BVHBuilderMorton::BuildPrim>>
              (this->morton + current->_begin,this->morton + current->_end,
               (less<embree::sse2::BVHBuilderMorton::BuildPrim> *)&local_d8);
  }
  return;
}

Assistant:

__noinline void recreateMortonCodes(const range<unsigned>& current) const
        {
          /* fast path for small ranges */
          if (likely(current.size() < 1024))
          {
            /*! recalculate centroid bounds */
            BBox3fa centBounds(empty);
            for (size_t i=current.begin(); i<current.end(); i++)
              centBounds.extend(center2(calculateBounds(morton[i])));

            /* recalculate morton codes */
            MortonCodeMapping mapping(centBounds);
            for (size_t i=current.begin(); i<current.end(); i++)
              morton[i].code = mapping.code(calculateBounds(morton[i]));

            /* sort morton codes */
            std::sort(morton+current.begin(),morton+current.end());
          }
          else
          {
            /*! recalculate centroid bounds */
            auto calculateCentBounds = [&] ( const range<unsigned>& r ) {
              BBox3fa centBounds = empty;
              for (size_t i=r.begin(); i<r.end(); i++)
                centBounds.extend(center2(calculateBounds(morton[i])));
              return centBounds;
            };
            const BBox3fa centBounds = parallel_reduce(current.begin(), current.end(), unsigned(1024),
                                                       BBox3fa(empty), calculateCentBounds, BBox3fa::merge);

            /* recalculate morton codes */
            MortonCodeMapping mapping(centBounds);
            parallel_for(current.begin(), current.end(), unsigned(1024), [&] ( const range<unsigned>& r ) {
                for (size_t i=r.begin(); i<r.end(); i++) {
                  morton[i].code = mapping.code(calculateBounds(morton[i]));
                }
              });

            /*! sort morton codes */
#if defined(TASKING_TBB)
            tbb::parallel_sort(morton+current.begin(),morton+current.end());
#else
            radixsort32(morton+current.begin(),current.size());
#endif
          }
        }